

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

size_t get_bs_chunk_size(int tg_or_tile_size,int frame_or_tg_size,size_t *remain_buf_size,
                        size_t max_buf_size,int is_last_chunk)

{
  uint64_t size_scale;
  size_t this_chunk_size;
  int is_last_chunk_local;
  size_t max_buf_size_local;
  size_t *remain_buf_size_local;
  int frame_or_tg_size_local;
  int tg_or_tile_size_local;
  
  if (is_last_chunk == 0) {
    this_chunk_size = (max_buf_size * (long)tg_or_tile_size) / (ulong)(long)frame_or_tg_size;
    *remain_buf_size = *remain_buf_size - this_chunk_size;
  }
  else {
    this_chunk_size = *remain_buf_size;
    *remain_buf_size = 0;
  }
  return this_chunk_size;
}

Assistant:

static inline size_t get_bs_chunk_size(int tg_or_tile_size,
                                       const int frame_or_tg_size,
                                       size_t *remain_buf_size,
                                       size_t max_buf_size, int is_last_chunk) {
  size_t this_chunk_size;
  assert(*remain_buf_size > 0);
  if (is_last_chunk) {
    this_chunk_size = *remain_buf_size;
    *remain_buf_size = 0;
  } else {
    const uint64_t size_scale = (uint64_t)max_buf_size * tg_or_tile_size;
    this_chunk_size = (size_t)(size_scale / frame_or_tg_size);
    *remain_buf_size -= this_chunk_size;
    assert(*remain_buf_size > 0);
  }
  assert(this_chunk_size > 0);
  return this_chunk_size;
}